

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O1

void __thiscall
wasm::
SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
::erase(SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
        *this,uint *x)

{
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar1;
  
  if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pVar1 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::equal_range(&(this->flexible)._M_t,x);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase_aux(&(this->flexible)._M_t,(_Base_ptr)pVar1.first._M_node,
                   (_Base_ptr)pVar1.second._M_node);
    return;
  }
  OrderedFixedStorage<unsigned_int,_3UL>::erase(&this->fixed,x);
  return;
}

Assistant:

void erase(const T& x) {
    if (usingFixed()) {
      fixed.erase(x);
    } else {
      flexible.erase(x);
    }
  }